

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mime.c
# Opt level: O0

size_t encoder_qp_read(char *buffer,size_t size,_Bool ateof,curl_mimepart *part)

{
  int iVar1;
  mime_encoder_state *st_00;
  undefined4 local_6c;
  char local_68;
  char local_67;
  char local_66;
  uint local_64;
  char buf [4];
  int softlinebreak;
  size_t consumed;
  size_t len;
  size_t sStack_48;
  int i;
  size_t cursize;
  char *ptr;
  mime_encoder_state *st;
  curl_mimepart *part_local;
  size_t sStack_20;
  _Bool ateof_local;
  size_t size_local;
  char *buffer_local;
  
  st_00 = &part->encstate;
  sStack_48 = 0;
  cursize = (size_t)buffer;
  sStack_20 = size;
  while( true ) {
    if ((part->encstate).bufend <= (part->encstate).bufbeg) {
      return sStack_48;
    }
    consumed = 1;
    _buf = 1;
    local_68 = (part->encstate).buf[(part->encstate).bufbeg];
    local_67 = "0123456789ABCDEF"[(uint)(int)local_68 >> 4 & 0xf];
    local_66 = "0123456789ABCDEF"[(int)local_68 & 0xf];
    local_6c = (uint)""[(byte)(part->encstate).buf[(part->encstate).bufbeg]];
    if (local_6c != 1) {
      if (local_6c == 2) {
        iVar1 = qp_lookahead_eol(st_00,ateof & 1,1);
        if (iVar1 == -1) {
          return sStack_48;
        }
        if (iVar1 != 0) {
          local_68 = '=';
          consumed = 3;
        }
      }
      else if (local_6c == 3) {
        iVar1 = qp_lookahead_eol(st_00,ateof & 1,0);
        if (iVar1 == -1) {
          return sStack_48;
        }
        if (iVar1 == 1) {
          consumed = 2;
          local_67 = '\n';
          _buf = 2;
        }
        else {
          local_68 = '=';
          consumed = 3;
        }
      }
      else {
        local_68 = '=';
        consumed = 3;
      }
    }
    if (*(char *)((long)&local_6c + consumed + 3) != '\n') {
      local_64 = (uint)(0x4c < st_00->pos + consumed);
      if ((local_64 == 0) && (st_00->pos + consumed == 0x4c)) {
        iVar1 = qp_lookahead_eol(st_00,ateof & 1,_buf);
        if (iVar1 == -1) {
          return sStack_48;
        }
        if (iVar1 == 0) {
          local_64 = 1;
        }
      }
      if (local_64 != 0) {
        strcpy(&local_68,"=\r\n");
        consumed = 3;
        _buf = 0;
      }
    }
    if (sStack_20 < consumed) break;
    memcpy((void *)cursize,&local_68,consumed);
    sStack_48 = consumed + sStack_48;
    cursize = consumed + cursize;
    sStack_20 = sStack_20 - consumed;
    st_00->pos = consumed + st_00->pos;
    if (*(char *)((long)&local_6c + consumed + 3) == '\n') {
      st_00->pos = 0;
    }
    (part->encstate).bufbeg = _buf + (part->encstate).bufbeg;
  }
  return sStack_48;
}

Assistant:

static size_t encoder_qp_read(char *buffer, size_t size, bool ateof,
                              curl_mimepart *part)
{
  mime_encoder_state *st = &part->encstate;
  char *ptr = buffer;
  size_t cursize = 0;
  int i;
  size_t len;
  size_t consumed;
  int softlinebreak;
  char buf[4];

  /* On all platforms, input is supposed to be ASCII compatible: for this
     reason, we use hexadecimal ASCII codes in this function rather than
     character constants that can be interpreted as non-ascii on some
     platforms. Preserve ASCII encoding on output too. */
  while(st->bufbeg < st->bufend) {
    len = 1;
    consumed = 1;
    i = st->buf[st->bufbeg];
    buf[0] = (char) i;
    buf[1] = aschex[(i >> 4) & 0xF];
    buf[2] = aschex[i & 0xF];

    switch(qp_class[st->buf[st->bufbeg] & 0xFF]) {
    case QP_OK:          /* Not a special character. */
      break;
    case QP_SP:          /* Space or tab. */
      /* Spacing must be escaped if followed by CRLF. */
      switch(qp_lookahead_eol(st, ateof, 1)) {
      case -1:          /* More input data needed. */
        return cursize;
      case 0:           /* No encoding needed. */
        break;
      default:          /* CRLF after space or tab. */
        buf[0] = '\x3D';    /* '=' */
        len = 3;
        break;
      }
      break;
    case QP_CR:         /* Carriage return. */
      /* If followed by a line-feed, output the CRLF pair.
         Else escape it. */
      switch(qp_lookahead_eol(st, ateof, 0)) {
      case -1:          /* Need more data. */
        return cursize;
      case 1:           /* CRLF found. */
        buf[len++] = '\x0A';    /* Append '\n'. */
        consumed = 2;
        break;
      default:          /* Not followed by LF: escape. */
        buf[0] = '\x3D';    /* '=' */
        len = 3;
        break;
      }
      break;
    default:            /* Character must be escaped. */
      buf[0] = '\x3D';    /* '=' */
      len = 3;
      break;
    }

    /* Be sure the encoded character fits within maximum line length. */
    if(buf[len - 1] != '\x0A') {    /* '\n' */
      softlinebreak = st->pos + len > MAX_ENCODED_LINE_LENGTH;
      if(!softlinebreak && st->pos + len == MAX_ENCODED_LINE_LENGTH) {
        /* We may use the current line only if end of data or followed by
           a CRLF. */
        switch(qp_lookahead_eol(st, ateof, consumed)) {
        case -1:        /* Need more data. */
          return cursize;
          break;
        case 0:         /* Not followed by a CRLF. */
          softlinebreak = 1;
          break;
        }
      }
      if(softlinebreak) {
        strcpy(buf, "\x3D\x0D\x0A");    /* "=\r\n" */
        len = 3;
        consumed = 0;
      }
    }

    /* If the output buffer would overflow, do not store. */
    if(len > size)
      break;

    /* Append to output buffer. */
    memcpy(ptr, buf, len);
    cursize += len;
    ptr += len;
    size -= len;
    st->pos += len;
    if(buf[len - 1] == '\x0A')    /* '\n' */
      st->pos = 0;
    st->bufbeg += consumed;
  }

  return cursize;
}